

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

OpenMDBitSet * __thiscall
OpenMD::OpenMDBitSet::get
          (OpenMDBitSet *__return_storage_ptr__,OpenMDBitSet *this,size_t fromIndex,size_t toIndex)

{
  long lVar1;
  _Bit_iterator __first;
  _Bit_iterator __last;
  
  lVar1 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __first.super__Bit_iterator_base._M_p =
       lVar1 + ((long)fromIndex / 0x40) * 8 +
       (ulong)((fromIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  __last.super__Bit_iterator_base._M_p =
       lVar1 + ((long)toIndex / 0x40) * 8 +
       (ulong)((toIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  __last.super__Bit_iterator_base._M_offset = (uint)toIndex & 0x3f;
  (__return_storage_ptr__->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  __first.super__Bit_iterator_base._M_offset = (uint)fromIndex & 0x3f;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::_Bit_iterator,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>>
            (__first,__last,
             (back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_>)__return_storage_ptr__
            );
  return __return_storage_ptr__;
}

Assistant:

OpenMDBitSet OpenMDBitSet::get(size_t fromIndex, size_t toIndex) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;

    OpenMDBitSet result;
    std::copy(first, last, std::back_inserter(result.bitset_));
    return result;
  }